

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O3

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Filter
          (Relation *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expression)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<duckdb::Relation,_true> sVar3;
  undefined1 local_49;
  shared_ptr<duckdb::FilterRelation,_true> local_48;
  enable_shared_from_this<duckdb::Relation> local_38;
  shared_ptr<duckdb::FilterRelation> local_28;
  
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_38);
  local_28.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::FilterRelation,std::allocator<duckdb::FilterRelation>,duckdb::shared_ptr<duckdb::Relation,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (&local_28.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FilterRelation **)&local_28,
             (allocator<duckdb::FilterRelation> *)&local_49,
             (shared_ptr<duckdb::Relation,_true> *)&local_38,in_RDX);
  shared_ptr<duckdb::FilterRelation,_true>::shared_ptr(&local_48,&local_28);
  _Var2._M_pi = extraout_RDX;
  if (local_28.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  _Var1._M_pi = local_48.internal.
                super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_48.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation =
       (_func_int **)
       local_48.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_48.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (local_38.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.__weak_this_.internal.
               super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::Filter(unique_ptr<ParsedExpression> expression) {
	return make_shared_ptr<FilterRelation>(shared_from_this(), std::move(expression));
}